

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigopcount_tests.cpp
# Opt level: O0

void __thiscall sigopcount_tests::GetTxSigOpCost::test_method(GetTxSigOpCost *this)

{
  long lVar1;
  span<const_unsigned_char,_18446744073709551615UL> b;
  span<const_unsigned_char,_18446744073709551615UL> b_00;
  span<const_unsigned_char,_18446744073709551615UL> b_01;
  span<const_unsigned_char,_18446744073709551615UL> b_02;
  span<const_unsigned_char,_18446744073709551615UL> b_03;
  span<const_unsigned_char,_18446744073709551615UL> b_04;
  span<const_unsigned_char,_18446744073709551615UL> b_05;
  span<const_unsigned_char,_18446744073709551615UL> b_06;
  span<const_unsigned_char,_18446744073709551615UL> b_07;
  span<const_unsigned_char,_18446744073709551615UL> b_08;
  span<const_unsigned_char,_18446744073709551615UL> b_09;
  ScriptError SVar2;
  int64_t iVar3;
  uchar *puVar4;
  CMutableTransaction *spendingTx_00;
  CCoinsViewCache *coins_00;
  CTransaction *output;
  CScript *witness;
  CTransaction *tx;
  CCoinsViewCache *inputs;
  CMutableTransaction *tx_00;
  iterator __args;
  long in_FS_OFFSET;
  CCoinsViewCache *in_stack_ffffffffffffe9e8;
  undefined4 in_stack_ffffffffffffe9f0;
  size_type in_stack_ffffffffffffe9f4;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_stack_ffffffffffffe9f8;
  ScriptHash *in_stack_ffffffffffffea00;
  CScript *in_stack_ffffffffffffea08;
  CScriptWitness *this_00;
  CKey *in_stack_ffffffffffffea10;
  undefined8 in_stack_ffffffffffffea18;
  opcodetype opcode;
  CMutableTransaction *in_stack_ffffffffffffea20;
  undefined7 in_stack_ffffffffffffea28;
  undefined7 uVar5;
  undefined1 in_stack_ffffffffffffea2f;
  undefined1 uVar6;
  CCoinsView *in_stack_ffffffffffffea30;
  uint32_t uVar7;
  CCoinsViewCache *in_stack_ffffffffffffea38;
  CTransaction *in_stack_ffffffffffffea40;
  CScriptWitness *in_stack_ffffffffffffea50;
  uint32_t uVar8;
  CMutableTransaction *in_stack_ffffffffffffea58;
  CMutableTransaction *input;
  CTransaction *in_stack_ffffffffffffea60;
  undefined4 in_stack_ffffffffffffea68;
  undefined4 in_stack_ffffffffffffea6c;
  CCoinsViewCache *in_stack_ffffffffffffea70;
  CMutableTransaction *in_stack_ffffffffffffea78;
  uint32_t flags;
  GetTxSigOpCost *this_local;
  CScriptWitness scriptWitness_3;
  CScriptWitness scriptWitness_2;
  CScriptWitness scriptWitness_1;
  CScriptWitness scriptWitness;
  CKey key;
  CCoinsView coinsDummy;
  CMutableTransaction spendingTx;
  CMutableTransaction creationTx;
  CScript scriptSig_5;
  undefined1 local_f38 [80];
  CScript scriptPubKey_5;
  undefined1 local_ea8 [80];
  CScript redeemScript_1;
  undefined1 local_e38 [32];
  CScript witnessScript_1;
  CScript scriptSig_4;
  CScript scriptPubKey_4;
  CScript witnessScript;
  CScript scriptPubKey_3;
  CScript scriptSig_3;
  CScript scriptSig_2;
  CScript scriptPubKey_2;
  CScript scriptSig_1;
  CScript scriptPubKey_1;
  CScript redeemScript;
  CScript scriptSig;
  CScript scriptPubKey;
  CPubKey pubkey;
  CCoinsViewCache coins;
  
  opcode = (opcodetype)((ulong)in_stack_ffffffffffffea18 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffe9e8);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffe9e8);
  CCoinsView::CCoinsView((CCoinsView *)in_stack_ffffffffffffe9e8);
  CCoinsViewCache::CCoinsViewCache
            (in_stack_ffffffffffffea38,in_stack_ffffffffffffea30,(bool)in_stack_ffffffffffffea2f);
  uVar7 = (uint32_t)((ulong)in_stack_ffffffffffffea30 >> 0x20);
  GenerateRandomKey(SUB41(in_stack_ffffffffffffe9f4 >> 0x18,0));
  CKey::GetPubKey(in_stack_ffffffffffffea10);
  CScript::CScript((CScript *)in_stack_ffffffffffffe9e8);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe9f8,
                      CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0));
  ToByteVector<CPubKey>((CPubKey *)CONCAT17(in_stack_ffffffffffffea2f,in_stack_ffffffffffffea28));
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffe9f8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0));
  b._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffea28;
  b._M_ptr = (pointer)in_stack_ffffffffffffea20;
  b._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffea2f;
  CScript::operator<<(in_stack_ffffffffffffea08,b);
  ToByteVector<CPubKey>((CPubKey *)CONCAT17(in_stack_ffffffffffffea2f,in_stack_ffffffffffffea28));
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffe9f8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0));
  b_00._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffea28;
  b_00._M_ptr = (pointer)in_stack_ffffffffffffea20;
  b_00._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffea2f;
  CScript::operator<<(in_stack_ffffffffffffea08,b_00);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe9f8,
                      CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0));
  CScript::operator<<((CScript *)in_stack_ffffffffffffea20,opcode);
  CScript::CScript((CScript *)in_stack_ffffffffffffe9e8,(CScript *)0xae16c0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe9f8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe9f8);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe9e8);
  CScript::CScript((CScript *)in_stack_ffffffffffffe9e8);
  CScript::operator<<((CScript *)in_stack_ffffffffffffea20,opcode);
  CScript::operator<<((CScript *)in_stack_ffffffffffffea20,opcode);
  CScript::CScript((CScript *)in_stack_ffffffffffffe9e8,(CScript *)0xae1758);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe9e8);
  CScriptWitness::CScriptWitness((CScriptWitness *)in_stack_ffffffffffffe9e8);
  BuildTxs(in_stack_ffffffffffffea78,in_stack_ffffffffffffea70,
           (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffea6c,in_stack_ffffffffffffea68),
           (CScript *)in_stack_ffffffffffffea60,(CScript *)in_stack_ffffffffffffea58,
           in_stack_ffffffffffffea50);
  CScriptWitness::~CScriptWitness((CScriptWitness *)in_stack_ffffffffffffe9e8);
  CTransaction::CTransaction
            ((CTransaction *)CONCAT17(in_stack_ffffffffffffea2f,in_stack_ffffffffffffea28),
             in_stack_ffffffffffffea20);
  iVar3 = GetTransactionSigOpCost(in_stack_ffffffffffffea40,in_stack_ffffffffffffea38,uVar7);
  if (iVar3 != 0) {
    __assert_fail("GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                  ,0x89,"void sigopcount_tests::GetTxSigOpCost::test_method()");
  }
  CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffe9e8);
  CTransaction::CTransaction
            ((CTransaction *)CONCAT17(in_stack_ffffffffffffea2f,in_stack_ffffffffffffea28),
             in_stack_ffffffffffffea20);
  iVar3 = GetTransactionSigOpCost(in_stack_ffffffffffffea40,in_stack_ffffffffffffea38,uVar7);
  if (iVar3 != 0x50) {
    __assert_fail("GetTransactionSigOpCost(CTransaction(creationTx), coins, flags) == MAX_PUBKEYS_PER_MULTISIG * WITNESS_SCALE_FACTOR"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                  ,0x8c,"void sigopcount_tests::GetTxSigOpCost::test_method()");
  }
  CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffe9e8);
  CTransaction::CTransaction
            ((CTransaction *)CONCAT17(in_stack_ffffffffffffea2f,in_stack_ffffffffffffea28),
             in_stack_ffffffffffffea20);
  SVar2 = VerifyWithFlag(in_stack_ffffffffffffea60,in_stack_ffffffffffffea58,
                         (uint32_t)((ulong)in_stack_ffffffffffffea50 >> 0x20));
  if (SVar2 != SCRIPT_ERR_CHECKMULTISIGVERIFY) {
    __assert_fail("VerifyWithFlag(CTransaction(creationTx), spendingTx, flags) == SCRIPT_ERR_CHECKMULTISIGVERIFY"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                  ,0x8e,"void sigopcount_tests::GetTxSigOpCost::test_method()");
  }
  CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffe9e8);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe9e8);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe9e8);
  CScript::CScript((CScript *)in_stack_ffffffffffffe9e8);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe9f8,
                      CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0));
  ToByteVector<CPubKey>((CPubKey *)CONCAT17(in_stack_ffffffffffffea2f,in_stack_ffffffffffffea28));
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffe9f8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0));
  b_01._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffea28;
  b_01._M_ptr = (pointer)in_stack_ffffffffffffea20;
  b_01._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffea2f;
  CScript::operator<<(in_stack_ffffffffffffea08,b_01);
  ToByteVector<CPubKey>((CPubKey *)CONCAT17(in_stack_ffffffffffffea2f,in_stack_ffffffffffffea28));
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffe9f8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0));
  b_02._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffea28;
  b_02._M_ptr = (pointer)in_stack_ffffffffffffea20;
  b_02._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffea2f;
  CScript::operator<<(in_stack_ffffffffffffea08,b_02);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe9f8,
                      CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0));
  CScript::operator<<((CScript *)in_stack_ffffffffffffea20,opcode);
  CScript::CScript((CScript *)in_stack_ffffffffffffe9e8,(CScript *)0xae1c4b);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe9f8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe9f8);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe9e8);
  ScriptHash::ScriptHash(in_stack_ffffffffffffea00,(CScript *)in_stack_ffffffffffffe9f8);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<ScriptHash,void,void,ScriptHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffe9f8,
             (ScriptHash *)CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0));
  GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffe9e8);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffe9e8);
  CScript::CScript((CScript *)in_stack_ffffffffffffe9e8);
  CScript::operator<<((CScript *)in_stack_ffffffffffffea20,opcode);
  CScript::operator<<((CScript *)in_stack_ffffffffffffea20,opcode);
  ToByteVector<CScript>((CScript *)CONCAT17(in_stack_ffffffffffffea2f,in_stack_ffffffffffffea28));
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffe9f8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0));
  b_03._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffea28;
  b_03._M_ptr = (pointer)in_stack_ffffffffffffea20;
  b_03._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffea2f;
  CScript::operator<<(in_stack_ffffffffffffea08,b_03);
  CScript::CScript((CScript *)in_stack_ffffffffffffe9e8,(CScript *)0xae1d8e);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe9f8);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe9e8);
  CScriptWitness::CScriptWitness((CScriptWitness *)in_stack_ffffffffffffe9e8);
  BuildTxs(in_stack_ffffffffffffea78,in_stack_ffffffffffffea70,
           (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffea6c,in_stack_ffffffffffffea68),
           (CScript *)in_stack_ffffffffffffea60,(CScript *)in_stack_ffffffffffffea58,
           in_stack_ffffffffffffea50);
  CScriptWitness::~CScriptWitness((CScriptWitness *)in_stack_ffffffffffffe9e8);
  CTransaction::CTransaction
            ((CTransaction *)CONCAT17(in_stack_ffffffffffffea2f,in_stack_ffffffffffffea28),
             in_stack_ffffffffffffea20);
  iVar3 = GetTransactionSigOpCost(in_stack_ffffffffffffea40,in_stack_ffffffffffffea38,uVar7);
  if (iVar3 != 8) {
    __assert_fail("GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 2 * WITNESS_SCALE_FACTOR"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                  ,0x98,"void sigopcount_tests::GetTxSigOpCost::test_method()");
  }
  CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffe9e8);
  CTransaction::CTransaction
            ((CTransaction *)CONCAT17(in_stack_ffffffffffffea2f,in_stack_ffffffffffffea28),
             in_stack_ffffffffffffea20);
  SVar2 = VerifyWithFlag(in_stack_ffffffffffffea60,in_stack_ffffffffffffea58,
                         (uint32_t)((ulong)in_stack_ffffffffffffea50 >> 0x20));
  if (SVar2 != SCRIPT_ERR_CHECKMULTISIGVERIFY) {
    __assert_fail("VerifyWithFlag(CTransaction(creationTx), spendingTx, flags) == SCRIPT_ERR_CHECKMULTISIGVERIFY"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                  ,0x99,"void sigopcount_tests::GetTxSigOpCost::test_method()");
  }
  CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffe9e8);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe9e8);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe9e8);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe9e8);
  WitnessV0KeyHash::WitnessV0KeyHash
            ((WitnessV0KeyHash *)in_stack_ffffffffffffea00,(CPubKey *)in_stack_ffffffffffffe9f8);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<WitnessV0KeyHash,void,void,WitnessV0KeyHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffe9f8,
             (WitnessV0KeyHash *)CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0));
  GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffe9e8);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffe9e8);
  CScript::CScript((CScript *)in_stack_ffffffffffffe9e8);
  CScriptWitness::CScriptWitness((CScriptWitness *)in_stack_ffffffffffffe9e8);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::emplace_back<int>((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)in_stack_ffffffffffffea08,(int *)in_stack_ffffffffffffea00);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::emplace_back<int>((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)in_stack_ffffffffffffea08,(int *)in_stack_ffffffffffffea00);
  BuildTxs(in_stack_ffffffffffffea78,in_stack_ffffffffffffea70,
           (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffea6c,in_stack_ffffffffffffea68),
           (CScript *)in_stack_ffffffffffffea60,(CScript *)in_stack_ffffffffffffea58,
           in_stack_ffffffffffffea50);
  CTransaction::CTransaction
            ((CTransaction *)CONCAT17(in_stack_ffffffffffffea2f,in_stack_ffffffffffffea28),
             in_stack_ffffffffffffea20);
  iVar3 = GetTransactionSigOpCost(in_stack_ffffffffffffea40,in_stack_ffffffffffffea38,uVar7);
  if (iVar3 != 1) {
    __assert_fail("GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                  ,0xa6,"void sigopcount_tests::GetTxSigOpCost::test_method()");
  }
  CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffe9e8);
  CTransaction::CTransaction
            ((CTransaction *)CONCAT17(in_stack_ffffffffffffea2f,in_stack_ffffffffffffea28),
             in_stack_ffffffffffffea20);
  iVar3 = GetTransactionSigOpCost(in_stack_ffffffffffffea40,in_stack_ffffffffffffea38,uVar7);
  if (iVar3 != 0) {
    __assert_fail("GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags & ~SCRIPT_VERIFY_WITNESS) == 0"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                  ,0xa8,"void sigopcount_tests::GetTxSigOpCost::test_method()");
  }
  CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffe9e8);
  CTransaction::CTransaction
            ((CTransaction *)CONCAT17(in_stack_ffffffffffffea2f,in_stack_ffffffffffffea28),
             in_stack_ffffffffffffea20);
  SVar2 = VerifyWithFlag(in_stack_ffffffffffffea60,in_stack_ffffffffffffea58,
                         (uint32_t)((ulong)in_stack_ffffffffffffea50 >> 0x20));
  if (SVar2 != SCRIPT_ERR_EQUALVERIFY) {
    __assert_fail("VerifyWithFlag(CTransaction(creationTx), spendingTx, flags) == SCRIPT_ERR_EQUALVERIFY"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                  ,0xa9,"void sigopcount_tests::GetTxSigOpCost::test_method()");
  }
  CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffe9e8);
  puVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                     (in_stack_ffffffffffffe9f8,in_stack_ffffffffffffe9f4);
  if (*puVar4 != '\0') {
    __assert_fail("scriptPubKey[0] == 0x00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                  ,0xac,"void sigopcount_tests::GetTxSigOpCost::test_method()");
  }
  puVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                     (in_stack_ffffffffffffe9f8,in_stack_ffffffffffffe9f4);
  *puVar4 = 'Q';
  BuildTxs(in_stack_ffffffffffffea78,in_stack_ffffffffffffea70,
           (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffea6c,in_stack_ffffffffffffea68),
           (CScript *)in_stack_ffffffffffffea60,(CScript *)in_stack_ffffffffffffea58,
           in_stack_ffffffffffffea50);
  CTransaction::CTransaction
            ((CTransaction *)CONCAT17(in_stack_ffffffffffffea2f,in_stack_ffffffffffffea28),
             in_stack_ffffffffffffea20);
  iVar3 = GetTransactionSigOpCost(in_stack_ffffffffffffea40,in_stack_ffffffffffffea38,uVar7);
  if (iVar3 != 0) {
    __assert_fail("GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                  ,0xaf,"void sigopcount_tests::GetTxSigOpCost::test_method()");
  }
  CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffe9e8);
  puVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                     (in_stack_ffffffffffffe9f8,in_stack_ffffffffffffe9f4);
  *puVar4 = '\0';
  BuildTxs(in_stack_ffffffffffffea78,in_stack_ffffffffffffea70,
           (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffea6c,in_stack_ffffffffffffea68),
           (CScript *)in_stack_ffffffffffffea60,(CScript *)in_stack_ffffffffffffea58,
           in_stack_ffffffffffffea50);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffe9f8,
             CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0));
  COutPoint::SetNull((COutPoint *)in_stack_ffffffffffffe9e8);
  CTransaction::CTransaction
            ((CTransaction *)CONCAT17(in_stack_ffffffffffffea2f,in_stack_ffffffffffffea28),
             in_stack_ffffffffffffea20);
  iVar3 = GetTransactionSigOpCost(in_stack_ffffffffffffea40,in_stack_ffffffffffffea38,uVar7);
  if (iVar3 != 0) {
    __assert_fail("GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                  ,0xb5,"void sigopcount_tests::GetTxSigOpCost::test_method()");
  }
  CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffe9e8);
  CScriptWitness::~CScriptWitness((CScriptWitness *)in_stack_ffffffffffffe9e8);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe9e8);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe9e8);
  WitnessV0KeyHash::WitnessV0KeyHash
            ((WitnessV0KeyHash *)in_stack_ffffffffffffea00,(CPubKey *)in_stack_ffffffffffffe9f8);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<WitnessV0KeyHash,void,void,WitnessV0KeyHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffe9f8,
             (WitnessV0KeyHash *)CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0));
  GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffe9e8);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffe9e8);
  ScriptHash::ScriptHash(in_stack_ffffffffffffea00,(CScript *)in_stack_ffffffffffffe9f8);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<ScriptHash,void,void,ScriptHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffe9f8,
             (ScriptHash *)CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0));
  GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffe9e8);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffe9e8);
  CScript::CScript((CScript *)in_stack_ffffffffffffe9e8);
  ToByteVector<CScript>((CScript *)CONCAT17(in_stack_ffffffffffffea2f,in_stack_ffffffffffffea28));
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffe9f8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0));
  b_04._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffea28;
  b_04._M_ptr = (pointer)in_stack_ffffffffffffea20;
  b_04._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffea2f;
  CScript::operator<<(in_stack_ffffffffffffea08,b_04);
  CScript::operator=((CScript *)in_stack_ffffffffffffe9f8,
                     (CScript *)CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe9f8);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe9e8);
  CScriptWitness::CScriptWitness((CScriptWitness *)in_stack_ffffffffffffe9e8);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::emplace_back<int>((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)in_stack_ffffffffffffea08,(int *)in_stack_ffffffffffffea00);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::emplace_back<int>((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)in_stack_ffffffffffffea08,(int *)in_stack_ffffffffffffea00);
  BuildTxs(in_stack_ffffffffffffea78,in_stack_ffffffffffffea70,
           (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffea6c,in_stack_ffffffffffffea68),
           (CScript *)in_stack_ffffffffffffea60,(CScript *)in_stack_ffffffffffffea58,
           in_stack_ffffffffffffea50);
  CTransaction::CTransaction
            ((CTransaction *)CONCAT17(in_stack_ffffffffffffea2f,in_stack_ffffffffffffea28),
             in_stack_ffffffffffffea20);
  iVar3 = GetTransactionSigOpCost(in_stack_ffffffffffffea40,in_stack_ffffffffffffea38,uVar7);
  if (iVar3 != 1) {
    __assert_fail("GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                  ,0xc2,"void sigopcount_tests::GetTxSigOpCost::test_method()");
  }
  CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffe9e8);
  CTransaction::CTransaction
            ((CTransaction *)CONCAT17(in_stack_ffffffffffffea2f,in_stack_ffffffffffffea28),
             in_stack_ffffffffffffea20);
  SVar2 = VerifyWithFlag(in_stack_ffffffffffffea60,in_stack_ffffffffffffea58,
                         (uint32_t)((ulong)in_stack_ffffffffffffea50 >> 0x20));
  if (SVar2 != SCRIPT_ERR_EQUALVERIFY) {
    __assert_fail("VerifyWithFlag(CTransaction(creationTx), spendingTx, flags) == SCRIPT_ERR_EQUALVERIFY"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                  ,0xc3,"void sigopcount_tests::GetTxSigOpCost::test_method()");
  }
  CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffe9e8);
  CScriptWitness::~CScriptWitness((CScriptWitness *)in_stack_ffffffffffffe9e8);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe9e8);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe9e8);
  CScript::CScript((CScript *)in_stack_ffffffffffffe9e8);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe9f8,
                      CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0));
  ToByteVector<CPubKey>((CPubKey *)CONCAT17(in_stack_ffffffffffffea2f,in_stack_ffffffffffffea28));
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffe9f8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0));
  b_05._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffea28;
  b_05._M_ptr = (pointer)in_stack_ffffffffffffea20;
  b_05._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffea2f;
  CScript::operator<<(in_stack_ffffffffffffea08,b_05);
  ToByteVector<CPubKey>((CPubKey *)CONCAT17(in_stack_ffffffffffffea2f,in_stack_ffffffffffffea28));
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffe9f8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0));
  b_06._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffea28;
  b_06._M_ptr = (pointer)in_stack_ffffffffffffea20;
  b_06._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffea2f;
  CScript::operator<<(in_stack_ffffffffffffea08,b_06);
  CScript::operator<<((CScript *)in_stack_ffffffffffffe9f8,
                      CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0));
  CScript::operator<<((CScript *)in_stack_ffffffffffffea20,opcode);
  CScript::CScript((CScript *)in_stack_ffffffffffffe9e8,(CScript *)0xae2c6a);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe9f8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe9f8);
  CScript::~CScript((CScript *)in_stack_ffffffffffffe9e8);
  WitnessV0ScriptHash::WitnessV0ScriptHash
            ((WitnessV0ScriptHash *)in_stack_ffffffffffffea10,in_stack_ffffffffffffea08);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<WitnessV0ScriptHash,void,void,WitnessV0ScriptHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffe9f8,
             (WitnessV0ScriptHash *)CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0));
  GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffe9e8);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffe9e8);
  CScript::CScript((CScript *)in_stack_ffffffffffffe9e8);
  CScriptWitness::CScriptWitness((CScriptWitness *)in_stack_ffffffffffffe9e8);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::emplace_back<int>((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)in_stack_ffffffffffffea08,(int *)in_stack_ffffffffffffea00);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::emplace_back<int>((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)in_stack_ffffffffffffea08,(int *)in_stack_ffffffffffffea00);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::begin
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
             CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0));
  prevector<28U,_unsigned_char,_unsigned_int,_int>::end
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
             CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0));
  std::
  vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
  ::
  emplace_back<prevector<28u,unsigned_char,unsigned_int,int>::iterator,prevector<28u,unsigned_char,unsigned_int,int>::iterator>
            ((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)in_stack_ffffffffffffea08,(iterator *)in_stack_ffffffffffffea00,
             (iterator *)in_stack_ffffffffffffe9f8);
  BuildTxs(in_stack_ffffffffffffea78,in_stack_ffffffffffffea70,
           (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffea6c,in_stack_ffffffffffffea68),
           (CScript *)in_stack_ffffffffffffea60,(CScript *)in_stack_ffffffffffffea58,
           in_stack_ffffffffffffea50);
  uVar8 = (uint32_t)((ulong)in_stack_ffffffffffffea50 >> 0x20);
  CTransaction::CTransaction
            ((CTransaction *)CONCAT17(in_stack_ffffffffffffea2f,in_stack_ffffffffffffea28),
             in_stack_ffffffffffffea20);
  spendingTx_00 =
       (CMutableTransaction *)
       GetTransactionSigOpCost(in_stack_ffffffffffffea40,in_stack_ffffffffffffea38,uVar7);
  if (spendingTx_00 != (CMutableTransaction *)0x2) {
    __assert_fail("GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                  ,0xd1,"void sigopcount_tests::GetTxSigOpCost::test_method()");
  }
  CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffe9e8);
  CTransaction::CTransaction
            ((CTransaction *)CONCAT17(in_stack_ffffffffffffea2f,in_stack_ffffffffffffea28),
             in_stack_ffffffffffffea20);
  coins_00 = (CCoinsViewCache *)
             GetTransactionSigOpCost(in_stack_ffffffffffffea40,in_stack_ffffffffffffea38,uVar7);
  if (coins_00 != (CCoinsViewCache *)0x0) {
    __assert_fail("GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags & ~SCRIPT_VERIFY_WITNESS) == 0"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                  ,0xd2,"void sigopcount_tests::GetTxSigOpCost::test_method()");
  }
  CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffe9e8);
  CTransaction::CTransaction
            ((CTransaction *)CONCAT17(in_stack_ffffffffffffea2f,in_stack_ffffffffffffea28),
             in_stack_ffffffffffffea20);
  SVar2 = VerifyWithFlag(in_stack_ffffffffffffea60,in_stack_ffffffffffffea58,uVar8);
  if (SVar2 == SCRIPT_ERR_CHECKMULTISIGVERIFY) {
    CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffe9e8);
    CScriptWitness::~CScriptWitness((CScriptWitness *)in_stack_ffffffffffffe9e8);
    CScript::~CScript((CScript *)in_stack_ffffffffffffe9e8);
    CScript::~CScript((CScript *)in_stack_ffffffffffffe9e8);
    CScript::~CScript((CScript *)in_stack_ffffffffffffe9e8);
    local_e38._16_8_ = (pointer)0x0;
    local_e38._24_8_ = (pointer)0x0;
    local_e38._0_8_ = (pointer)0x0;
    local_e38._8_8_ = (pointer)0x0;
    input = (CMutableTransaction *)local_e38;
    CScript::CScript((CScript *)in_stack_ffffffffffffe9e8);
    output = (CTransaction *)
             CScript::operator<<((CScript *)in_stack_ffffffffffffe9f8,
                                 CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0));
    ToByteVector<CPubKey>((CPubKey *)CONCAT17(in_stack_ffffffffffffea2f,in_stack_ffffffffffffea28));
    std::span<const_unsigned_char,_18446744073709551615UL>::
    span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffe9f8,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0));
    b_07._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffea28;
    b_07._M_ptr = (pointer)in_stack_ffffffffffffea20;
    b_07._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffea2f;
    witness = CScript::operator<<(in_stack_ffffffffffffea08,b_07);
    ToByteVector<CPubKey>((CPubKey *)CONCAT17(in_stack_ffffffffffffea2f,in_stack_ffffffffffffea28));
    std::span<const_unsigned_char,_18446744073709551615UL>::
    span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffe9f8,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0));
    b_08._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffea28;
    b_08._M_ptr = (pointer)in_stack_ffffffffffffea20;
    b_08._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffea2f;
    CScript::operator<<(in_stack_ffffffffffffea08,b_08);
    tx = (CTransaction *)
         CScript::operator<<((CScript *)in_stack_ffffffffffffe9f8,
                             CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0));
    inputs = (CCoinsViewCache *)CScript::operator<<((CScript *)in_stack_ffffffffffffea20,opcode);
    CScript::CScript((CScript *)in_stack_ffffffffffffe9e8,(CScript *)0xae324a);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe9f8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe9f8);
    CScript::~CScript((CScript *)in_stack_ffffffffffffe9e8);
    WitnessV0ScriptHash::WitnessV0ScriptHash
              ((WitnessV0ScriptHash *)in_stack_ffffffffffffea10,in_stack_ffffffffffffea08);
    uVar7 = (uint32_t)((ulong)local_ea8 >> 0x20);
    std::
    variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
    ::variant<WitnessV0ScriptHash,void,void,WitnessV0ScriptHash,void>
              ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                *)in_stack_ffffffffffffe9f8,
               (WitnessV0ScriptHash *)CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0))
    ;
    GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffe9e8);
    std::
    variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                *)in_stack_ffffffffffffe9e8);
    ScriptHash::ScriptHash(in_stack_ffffffffffffea00,(CScript *)in_stack_ffffffffffffe9f8);
    uVar5 = SUB87(local_f38,0);
    uVar6 = (undefined1)((ulong)local_f38 >> 0x38);
    std::
    variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
    ::variant<ScriptHash,void,void,ScriptHash,void>
              ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                *)in_stack_ffffffffffffe9f8,
               (ScriptHash *)CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0));
    GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffe9e8);
    std::
    variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                *)in_stack_ffffffffffffe9e8);
    CScript::CScript((CScript *)in_stack_ffffffffffffe9e8);
    ToByteVector<CScript>((CScript *)CONCAT17(uVar6,uVar5));
    std::span<const_unsigned_char,_18446744073709551615UL>::
    span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffe9f8,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0));
    b_09._M_extent._M_extent_value._0_7_ = uVar5;
    b_09._M_ptr = (pointer)in_stack_ffffffffffffea20;
    b_09._M_extent._M_extent_value._7_1_ = uVar6;
    tx_00 = (CMutableTransaction *)CScript::operator<<(in_stack_ffffffffffffea08,b_09);
    CScript::CScript((CScript *)in_stack_ffffffffffffe9e8,(CScript *)0xae3399);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe9f8);
    CScript::~CScript((CScript *)in_stack_ffffffffffffe9e8);
    CScriptWitness::CScriptWitness((CScriptWitness *)in_stack_ffffffffffffe9e8);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::emplace_back<int>((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)in_stack_ffffffffffffea08,(int *)in_stack_ffffffffffffea00);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::emplace_back<int>((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)in_stack_ffffffffffffea08,(int *)in_stack_ffffffffffffea00);
    this_00 = &scriptWitness_3;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::begin
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
               CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0));
    __args = prevector<28U,_unsigned_char,_unsigned_int,_int>::end
                       ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                        CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0));
    std::
    vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
    ::
    emplace_back<prevector<28u,unsigned_char,unsigned_int,int>::iterator,prevector<28u,unsigned_char,unsigned_int,int>::iterator>
              (&this_00->stack,(iterator *)__args.ptr,(iterator *)in_stack_ffffffffffffe9f8);
    BuildTxs(spendingTx_00,coins_00,(CMutableTransaction *)CONCAT44(SVar2,in_stack_ffffffffffffea68)
             ,(CScript *)output,(CScript *)input,(CScriptWitness *)witness);
    uVar8 = (uint32_t)((ulong)witness >> 0x20);
    CTransaction::CTransaction((CTransaction *)CONCAT17(uVar6,uVar5),tx_00);
    iVar3 = GetTransactionSigOpCost(tx,inputs,uVar7);
    if (iVar3 != 2) {
      __assert_fail("GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                    ,0xe2,"void sigopcount_tests::GetTxSigOpCost::test_method()");
    }
    CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffe9e8);
    CTransaction::CTransaction((CTransaction *)CONCAT17(uVar6,uVar5),tx_00);
    SVar2 = VerifyWithFlag(output,input,uVar8);
    if (SVar2 == SCRIPT_ERR_CHECKMULTISIGVERIFY) {
      CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffe9e8);
      CScriptWitness::~CScriptWitness((CScriptWitness *)in_stack_ffffffffffffe9e8);
      CScript::~CScript((CScript *)in_stack_ffffffffffffe9e8);
      CScript::~CScript((CScript *)in_stack_ffffffffffffe9e8);
      CScript::~CScript((CScript *)in_stack_ffffffffffffe9e8);
      CScript::~CScript((CScript *)in_stack_ffffffffffffe9e8);
      CKey::~CKey((CKey *)in_stack_ffffffffffffe9e8);
      CCoinsViewCache::~CCoinsViewCache(in_stack_ffffffffffffe9e8);
      CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffe9e8);
      CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffe9e8);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      __stack_chk_fail();
    }
    __assert_fail("VerifyWithFlag(CTransaction(creationTx), spendingTx, flags) == SCRIPT_ERR_CHECKMULTISIGVERIFY"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                  ,0xe3,"void sigopcount_tests::GetTxSigOpCost::test_method()");
  }
  __assert_fail("VerifyWithFlag(CTransaction(creationTx), spendingTx, flags) == SCRIPT_ERR_CHECKMULTISIGVERIFY"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
                ,0xd3,"void sigopcount_tests::GetTxSigOpCost::test_method()");
}

Assistant:

BOOST_AUTO_TEST_CASE(GetTxSigOpCost)
{
    // Transaction creates outputs
    CMutableTransaction creationTx;
    // Transaction that spends outputs and whose
    // sig op cost is going to be tested
    CMutableTransaction spendingTx;

    // Create utxo set
    CCoinsView coinsDummy;
    CCoinsViewCache coins(&coinsDummy);
    // Create key
    CKey key = GenerateRandomKey();
    CPubKey pubkey = key.GetPubKey();
    // Default flags
    const uint32_t flags{SCRIPT_VERIFY_WITNESS | SCRIPT_VERIFY_P2SH};

    // Multisig script (legacy counting)
    {
        CScript scriptPubKey = CScript() << 1 << ToByteVector(pubkey) << ToByteVector(pubkey) << 2 << OP_CHECKMULTISIGVERIFY;
        // Do not use a valid signature to avoid using wallet operations.
        CScript scriptSig = CScript() << OP_0 << OP_0;

        BuildTxs(spendingTx, coins, creationTx, scriptPubKey, scriptSig, CScriptWitness());
        // Legacy counting only includes signature operations in scriptSigs and scriptPubKeys
        // of a transaction and does not take the actual executed sig operations into account.
        // spendingTx in itself does not contain a signature operation.
        assert(GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 0);
        // creationTx contains two signature operations in its scriptPubKey, but legacy counting
        // is not accurate.
        assert(GetTransactionSigOpCost(CTransaction(creationTx), coins, flags) == MAX_PUBKEYS_PER_MULTISIG * WITNESS_SCALE_FACTOR);
        // Sanity check: script verification fails because of an invalid signature.
        assert(VerifyWithFlag(CTransaction(creationTx), spendingTx, flags) == SCRIPT_ERR_CHECKMULTISIGVERIFY);
    }

    // Multisig nested in P2SH
    {
        CScript redeemScript = CScript() << 1 << ToByteVector(pubkey) << ToByteVector(pubkey) << 2 << OP_CHECKMULTISIGVERIFY;
        CScript scriptPubKey = GetScriptForDestination(ScriptHash(redeemScript));
        CScript scriptSig = CScript() << OP_0 << OP_0 << ToByteVector(redeemScript);

        BuildTxs(spendingTx, coins, creationTx, scriptPubKey, scriptSig, CScriptWitness());
        assert(GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 2 * WITNESS_SCALE_FACTOR);
        assert(VerifyWithFlag(CTransaction(creationTx), spendingTx, flags) == SCRIPT_ERR_CHECKMULTISIGVERIFY);
    }

    // P2WPKH witness program
    {
        CScript scriptPubKey = GetScriptForDestination(WitnessV0KeyHash(pubkey));
        CScript scriptSig = CScript();
        CScriptWitness scriptWitness;
        scriptWitness.stack.emplace_back(0);
        scriptWitness.stack.emplace_back(0);


        BuildTxs(spendingTx, coins, creationTx, scriptPubKey, scriptSig, scriptWitness);
        assert(GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 1);
        // No signature operations if we don't verify the witness.
        assert(GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags & ~SCRIPT_VERIFY_WITNESS) == 0);
        assert(VerifyWithFlag(CTransaction(creationTx), spendingTx, flags) == SCRIPT_ERR_EQUALVERIFY);

        // The sig op cost for witness version != 0 is zero.
        assert(scriptPubKey[0] == 0x00);
        scriptPubKey[0] = 0x51;
        BuildTxs(spendingTx, coins, creationTx, scriptPubKey, scriptSig, scriptWitness);
        assert(GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 0);
        scriptPubKey[0] = 0x00;
        BuildTxs(spendingTx, coins, creationTx, scriptPubKey, scriptSig, scriptWitness);

        // The witness of a coinbase transaction is not taken into account.
        spendingTx.vin[0].prevout.SetNull();
        assert(GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 0);
    }

    // P2WPKH nested in P2SH
    {
        CScript scriptSig = GetScriptForDestination(WitnessV0KeyHash(pubkey));
        CScript scriptPubKey = GetScriptForDestination(ScriptHash(scriptSig));
        scriptSig = CScript() << ToByteVector(scriptSig);
        CScriptWitness scriptWitness;
        scriptWitness.stack.emplace_back(0);
        scriptWitness.stack.emplace_back(0);

        BuildTxs(spendingTx, coins, creationTx, scriptPubKey, scriptSig, scriptWitness);
        assert(GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 1);
        assert(VerifyWithFlag(CTransaction(creationTx), spendingTx, flags) == SCRIPT_ERR_EQUALVERIFY);
    }

    // P2WSH witness program
    {
        CScript witnessScript = CScript() << 1 << ToByteVector(pubkey) << ToByteVector(pubkey) << 2 << OP_CHECKMULTISIGVERIFY;
        CScript scriptPubKey = GetScriptForDestination(WitnessV0ScriptHash(witnessScript));
        CScript scriptSig = CScript();
        CScriptWitness scriptWitness;
        scriptWitness.stack.emplace_back(0);
        scriptWitness.stack.emplace_back(0);
        scriptWitness.stack.emplace_back(witnessScript.begin(), witnessScript.end());

        BuildTxs(spendingTx, coins, creationTx, scriptPubKey, scriptSig, scriptWitness);
        assert(GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 2);
        assert(GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags & ~SCRIPT_VERIFY_WITNESS) == 0);
        assert(VerifyWithFlag(CTransaction(creationTx), spendingTx, flags) == SCRIPT_ERR_CHECKMULTISIGVERIFY);
    }

    // P2WSH nested in P2SH
    {
        CScript witnessScript = CScript() << 1 << ToByteVector(pubkey) << ToByteVector(pubkey) << 2 << OP_CHECKMULTISIGVERIFY;
        CScript redeemScript = GetScriptForDestination(WitnessV0ScriptHash(witnessScript));
        CScript scriptPubKey = GetScriptForDestination(ScriptHash(redeemScript));
        CScript scriptSig = CScript() << ToByteVector(redeemScript);
        CScriptWitness scriptWitness;
        scriptWitness.stack.emplace_back(0);
        scriptWitness.stack.emplace_back(0);
        scriptWitness.stack.emplace_back(witnessScript.begin(), witnessScript.end());

        BuildTxs(spendingTx, coins, creationTx, scriptPubKey, scriptSig, scriptWitness);
        assert(GetTransactionSigOpCost(CTransaction(spendingTx), coins, flags) == 2);
        assert(VerifyWithFlag(CTransaction(creationTx), spendingTx, flags) == SCRIPT_ERR_CHECKMULTISIGVERIFY);
    }
}